

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

node * make_tree(float32 **means,float32 **vars,float32 ***mixw,int32 *phnids,int32 nphones,
                int32 ndensity,int32 nfeat,int32 dim,int32 npermute,int32 depth,int32 continuous)

{
  cmd_ln_t *cmdln;
  long lVar1;
  node *sroot_00;
  node *pnVar2;
  node *sroot;
  int32 *piStack_90;
  int32 nrclass;
  int32 *rclass;
  int32 *piStack_80;
  int32 nlclass;
  int32 *lclass;
  int32 *llists;
  int32 **lists;
  int32 jpermute;
  int32 iter;
  int32 niter;
  float32 lkhddec;
  int32 ndensity_local;
  int32 nphones_local;
  int32 *phnids_local;
  float32 ***mixw_local;
  float32 **vars_local;
  float32 **means_local;
  
  niter = ndensity;
  lkhddec = (float32)nphones;
  _ndensity_local = phnids;
  phnids_local = (int32 *)mixw;
  mixw_local = (float32 ***)vars;
  vars_local = means;
  cmdln = cmd_ln_get();
  lVar1 = cmd_ln_int_r(cmdln,"-niter");
  jpermute = (int32)lVar1;
  sroot_00 = make_simple_tree(vars_local,(float32 **)mixw_local,(float32 ***)phnids_local,
                              _ndensity_local,(int32)lkhddec,niter,nfeat,dim,npermute,depth,
                              continuous);
  for (lists._4_4_ = 0; lists._4_4_ < jpermute; lists._4_4_ = lists._4_4_ + 1) {
    llists = (int32 *)__ckd_calloc_2d__((long)npermute,(long)(int)lkhddec,4,
                                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/make_quests/main.c"
                                        ,0x293);
    lclass = (int32 *)__ckd_calloc__((long)npermute,4,
                                     "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/make_quests/main.c"
                                     ,0x294);
    lists._0_4_ = pare_tree(sroot_00,npermute,(int32 **)llists,lclass);
    if ((int32)lists < 2) {
      sroot_00->right = (node_str *)0x0;
      sroot_00->left = (node_str *)0x0;
    }
    else {
      iter = (int32)permute(vars_local,(float32 **)mixw_local,(float32 ***)phnids_local,niter,nfeat,
                            dim,(int32 **)llists,lclass,(int32)lists,&stack0xffffffffffffff80,
                            &stack0xffffffffffffff70,(int32 *)((long)&rclass + 4),
                            (int32 *)((long)&sroot + 4),continuous);
      free_tree(sroot_00->left);
      free_tree(sroot_00->right);
      sroot_00->lkhd_dec = (float32)iter;
      pnVar2 = make_tree(vars_local,(float32 **)mixw_local,(float32 ***)phnids_local,piStack_80,
                         rclass._4_4_,niter,nfeat,dim,npermute,depth + 1,continuous);
      sroot_00->left = pnVar2;
      pnVar2 = make_tree(vars_local,(float32 **)mixw_local,(float32 ***)phnids_local,piStack_90,
                         sroot._4_4_,niter,nfeat,dim,npermute,depth + 1,continuous);
      sroot_00->right = pnVar2;
    }
    ckd_free_2d(llists);
    ckd_free(lclass);
  }
  return sroot_00;
}

Assistant:

node  *make_tree (float32 **means, float32 **vars, float32 ***mixw,
           int32 *phnids, int32 nphones, int32 ndensity, int32 nfeat,
           int32 dim, int32 npermute, int32 depth, int32 continuous)
{
    float32 lkhddec;
    int32 niter,iter,jpermute, **lists, *llists;
    int32 *lclass, nlclass, *rclass, nrclass;
    node *sroot;

    niter = cmd_ln_int32("-niter");

    sroot = make_simple_tree(means,vars,mixw,phnids,nphones,ndensity,nfeat,dim,npermute,depth, continuous);
    for (iter = 0; iter < niter; iter++) {
        /* overallocate lists of lists */
        lists = (int32 **) ckd_calloc_2d(npermute,nphones,sizeof(int32));
        llists = (int32 *) ckd_calloc(npermute,sizeof(int32));

        jpermute = pare_tree(sroot,npermute,lists,llists);
        if (jpermute > 1){
            lkhddec = permute(means,vars,mixw,ndensity,nfeat,dim,lists,llists,
                                   jpermute,&lclass,&rclass,&nlclass,&nrclass, continuous);
            free_tree(sroot->left); free_tree(sroot->right);
            sroot->lkhd_dec = lkhddec;
            sroot->left = 
                make_tree(means,vars,mixw,lclass,nlclass,ndensity,nfeat,
                          dim,npermute,depth+1, continuous);
            sroot->right = 
                make_tree(means,vars,mixw,rclass,nrclass,ndensity,nfeat,
                          dim,npermute,depth+1, continuous);
        }
        else { sroot->left = sroot->right = NULL; }
        ckd_free_2d((void **)lists); ckd_free(llists);
    }
    return(sroot);
}